

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_RemoveNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  long *plVar2;
  void *OldReferer;
  nodenotify *Top;
  nodenotify **Ptr;
  nodenotify *n;
  nodecontext *p;
  void *Referer_local;
  notifyproc Func_local;
  dataid Id_local;
  node *Node_local;
  nodenotify **local_18;
  notifyproc local_10;
  
  if (Node != (node *)0x0) {
    p = (nodecontext *)Referer;
    Referer_local = Func;
    Func_local = (notifyproc)Id;
    Id_local = (dataid)Node;
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x72a,"void Node_RemoveNotify(node *, dataid, notifyproc, void *)");
    }
    n = *Node->VMT;
    plVar2 = (long *)Node_GetData(Node,Id,0xe);
    if (plVar2 != (long *)0x0) {
      lVar1 = plVar2[2];
      Ptr = (nodenotify **)&Ptr;
      do {
        Top = (nodenotify *)Ptr;
        Ptr = &Top->Next->Next;
        if ((nodenotify *)Ptr == (nodenotify *)0x0) goto LAB_0011455b;
      } while ((((nodenotify *)Ptr)->Func != (notifyproc)Referer_local) ||
              ((nodecontext *)((nodenotify *)Ptr)->Referer != p));
      if (Top->Next == (nodenotify *)*plVar2) {
        *plVar2 = (long)((nodenotify *)Ptr)->Next;
      }
      else {
        Top->Next = ((nodenotify *)Ptr)->Next;
      }
      if ((nodenotify **)plVar2[2] == Ptr) {
        plVar2[2] = 0;
      }
      else {
        local_10 = n[5].Func;
        local_18 = Ptr;
        Node_local = (node *)0x18;
        (**(code **)(local_10 + 8))(local_10,Ptr,0x18);
      }
LAB_0011455b:
      if ((*plVar2 == 0) && (lVar1 == plVar2[2])) {
        Node_RemoveData((node *)Id_local,(dataid)Func_local,0xe);
      }
    }
  }
  return;
}

Assistant:

void Node_RemoveNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;

        n = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (n)
        {
            nodenotify** Ptr;
            nodenotify* Top = n;
            void *OldReferer = Top->Referer;

            n = Top->Next; // skip the first element which is just there to know if an item of the chain is being notified
            Ptr = &n;
            for (;(n=*Ptr)!=NULL;Ptr=&n->Next)
            {
                if (n->Func==Func && n->Referer==Referer)
                {
                    // remove the item from the list
                    if (*Ptr == Top->Next)
                        Top->Next = n->Next;
                    else
                        *Ptr = n->Next;

                    if (Top->Referer==n) // this notification item is being called
                        Top->Referer = NULL; // tell the notifier that it should remove this element after the call
                    else
                        MemHeap_Free(p->NodeHeap,n,sizeof(nodenotify));
                    break;
                }
            }

            if (Top->Next==NULL && OldReferer==Top->Referer)
                Node_RemoveData(Node,Id,TYPE_NODENOTIFY); // the notification list is empty and it's not being called
        }
    }
}